

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btPolyhedralContactClipping.cpp
# Opt level: O1

bool TestSepAxis(btConvexPolyhedron *hullA,btConvexPolyhedron *hullB,btTransform *transA,
                btTransform *transB,btVector3 *sep_axis,btScalar *depth,btVector3 *witnessPointA,
                btVector3 *witnessPointB)

{
  undefined8 uVar1;
  btVector3 *pbVar2;
  btVector3 *witnesPtMin;
  bool bVar3;
  btScalar Min1;
  btVector3 witnesPtMaxA;
  btVector3 witnesPtMaxB;
  btVector3 witnesPtMinB;
  btVector3 witnesPtMinA;
  undefined4 in_stack_ffffffffffffff70;
  float in_stack_ffffffffffffff74;
  float local_88;
  float local_84;
  btScalar *local_80;
  float local_74;
  btVector3 local_70;
  btVector3 local_60;
  btVector3 local_50;
  btVector3 local_40;
  
  local_80 = depth;
  btConvexPolyhedron::project
            (hullA,transA,sep_axis,&local_84,&local_88,&local_40,
             (btVector3 *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  witnesPtMin = &local_50;
  btConvexPolyhedron::project
            (hullB,transB,sep_axis,&local_74,(btScalar *)&stack0xffffffffffffff74,witnesPtMin,
             (btVector3 *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  if ((local_88 < local_74) || (in_stack_ffffffffffffff74 < local_84)) {
    bVar3 = false;
  }
  else {
    local_88 = local_88 - local_74;
    pbVar2 = &local_70;
    if (in_stack_ffffffffffffff74 - local_84 <= local_88) {
      local_88 = in_stack_ffffffffffffff74 - local_84;
      pbVar2 = &local_40;
      witnesPtMin = &local_60;
    }
    *local_80 = local_88;
    uVar1 = *(undefined8 *)(pbVar2->m_floats + 2);
    *(undefined8 *)witnessPointA->m_floats = *(undefined8 *)pbVar2->m_floats;
    *(undefined8 *)(witnessPointA->m_floats + 2) = uVar1;
    uVar1 = *(undefined8 *)(witnesPtMin->m_floats + 2);
    *(undefined8 *)witnessPointB->m_floats = *(undefined8 *)witnesPtMin->m_floats;
    *(undefined8 *)(witnessPointB->m_floats + 2) = uVar1;
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

static bool TestSepAxis(const btConvexPolyhedron& hullA, const btConvexPolyhedron& hullB, const btTransform& transA,const btTransform& transB, const btVector3& sep_axis, btScalar& depth, btVector3& witnessPointA, btVector3& witnessPointB)
{
	btScalar Min0,Max0;
	btScalar Min1,Max1;
	btVector3 witnesPtMinA,witnesPtMaxA;
	btVector3 witnesPtMinB,witnesPtMaxB;

	hullA.project(transA,sep_axis, Min0, Max0,witnesPtMinA,witnesPtMaxA);
	hullB.project(transB, sep_axis, Min1, Max1,witnesPtMinB,witnesPtMaxB);

	if(Max0<Min1 || Max1<Min0)
		return false;

	btScalar d0 = Max0 - Min1;
	btAssert(d0>=0.0f);
	btScalar d1 = Max1 - Min0;
	btAssert(d1>=0.0f);
	if (d0<d1)
	{
		depth = d0;
		witnessPointA = witnesPtMaxA;
		witnessPointB = witnesPtMinB;

	} else
	{
		depth = d1;
		witnessPointA = witnesPtMinA;
		witnessPointB = witnesPtMaxB;
	}
	
	return true;
}